

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_record.c
# Opt level: O2

log_record log_record_initialize(log_record record,log_record_ctor record_ctor)

{
  char *pcVar1;
  log_record_va_list_type *plVar2;
  time_t tVar3;
  uint64_t uVar4;
  
  if (record_ctor == (log_record_ctor)0x0 || record == (log_record)0x0) {
    record = (log_record)0x0;
  }
  else {
    tVar3 = time((time_t *)0x0);
    record->time = tVar3;
    uVar4 = thread_id_get_current();
    record->id = uVar4;
    record->line = record_ctor->line;
    pcVar1 = record_ctor->file;
    record->func = record_ctor->func;
    record->file = pcVar1;
    record->level = record_ctor->level;
    plVar2 = record_ctor->variable_args;
    record->message = record_ctor->message;
    record->variable_args = plVar2;
  }
  return record;
}

Assistant:

log_record log_record_initialize(log_record record, const log_record_ctor record_ctor)
{
	if (record != NULL && record_ctor != NULL)
	{
		record->time = time(NULL);
		record->id = thread_id_get_current();
		record->line = record_ctor->line;
		record->func = record_ctor->func;
		record->file = record_ctor->file;
		record->level = record_ctor->level;
		record->message = record_ctor->message;
		record->variable_args = record_ctor->variable_args;

		return record;
	}

	return NULL;
}